

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

file_status __thiscall
boost::filesystem::directory_entry::m_get_symlink_status(directory_entry *this,error_code *ec)

{
  undefined8 in_RAX;
  error_category *peVar1;
  error_code *in_RDX;
  undefined8 local_28;
  
  local_28._0_4_ = *(int *)&ec[2].m_cat;
  local_28._4_4_ = *(int *)((long)&ec[2].m_cat + 4);
  if ((int)local_28 == 0 || local_28._4_4_ == 0xffff) {
    local_28 = in_RAX;
    detail::symlink_status((detail *)&local_28,(path *)ec,in_RDX);
    *(int *)&ec[2].m_cat = (int)local_28;
    *(int *)((long)&ec[2].m_cat + 4) = local_28._4_4_;
  }
  else if (in_RDX != (error_code *)0x0) {
    in_RDX->m_val = 0;
    peVar1 = system::system_category();
    in_RDX->m_cat = peVar1;
    local_28._0_4_ = *(int *)&ec[2].m_cat;
    local_28._4_4_ = *(int *)((long)&ec[2].m_cat + 4);
  }
  *(int *)&(this->m_path).m_pathname._M_dataplus._M_p = (int)local_28;
  *(int *)((long)&(this->m_path).m_pathname._M_dataplus._M_p + 4) = local_28._4_4_;
  return (file_status)this;
}

Assistant:

file_status
  directory_entry::m_get_symlink_status(system::error_code* ec) const
  {
    if (!status_known(m_symlink_status))
      m_symlink_status = detail::symlink_status(m_path, ec);
    else if (ec != 0) ec->clear();
    return m_symlink_status;
  }